

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O0

void intgemm::kernel_multiply_test<(intgemm::CPUType)3,signed_char>(void)

{
  StringRef capturedExpression;
  vector_t<CPUType::AVX2,_int> b;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  longlong (*palVar4) [4];
  size_t sVar5;
  ITransientExpression *pIVar6;
  AssertionHandler *pAVar7;
  StringRef *pSVar8;
  AssertionHandler *pAVar9;
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<signed_char> output;
  AlignedVector<signed_char> input2;
  AlignedVector<signed_char> input1;
  int VECTOR_LENGTH;
  ITransientExpression *expr;
  size_t in_stack_fffffffffffffd68;
  AssertionHandler *this;
  size_t in_stack_fffffffffffffd70;
  StringRef *macroName;
  AlignedVector<signed_char> *in_stack_fffffffffffffd78;
  AssertionHandler *this_00;
  size_type sVar10;
  ExprLhs<const_signed_char_&> *in_stack_fffffffffffffda0;
  SourceLineInfo local_130;
  StringRef local_120;
  ulong local_c8;
  char *local_c0;
  size_type sStack_b8;
  longlong lStack_b0;
  char *pcStack_a8;
  ITransientExpression *local_a0;
  AssertionHandler *pAStack_98;
  StringRef *pSStack_90;
  undefined1 in_stack_ffffffffffffff80 [24];
  vector_t<CPUType::AVX2,_int> in_stack_ffffffffffffff98;
  AlignedVector<signed_char> local_48;
  undefined4 local_34;
  
  if (2 < kCPU) {
    local_34 = 0x20;
    AlignedVector<signed_char>::AlignedVector
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    AlignedVector<signed_char>::AlignedVector
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    AlignedVector<signed_char>::AlignedVector
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    pcVar2 = AlignedVector<signed_char>::begin(&local_48);
    pcVar3 = AlignedVector<signed_char>::end(&local_48);
    std::iota<signed_char*,signed_char>(pcVar2,pcVar3,-0x10);
    pcVar2 = AlignedVector<signed_char>::begin
                       ((AlignedVector<signed_char> *)&stack0xffffffffffffffa8);
    pcVar3 = AlignedVector<signed_char>::end((AlignedVector<signed_char> *)&stack0xffffffffffffffa8)
    ;
    std::iota<signed_char*,signed_char>(pcVar2,pcVar3,-10);
    palVar4 = AlignedVector<signed_char>::as<long_long__vector(4)>(&local_48);
    pIVar6 = (ITransientExpression *)(*palVar4)[0];
    pAVar7 = (AssertionHandler *)(*palVar4)[1];
    pSVar8 = (StringRef *)(*palVar4)[2];
    pAVar9 = (AssertionHandler *)(*palVar4)[3];
    palVar4 = AlignedVector<signed_char>::as<long_long__vector(4)>
                        ((AlignedVector<signed_char> *)&stack0xffffffffffffffa8);
    pcVar2 = (char *)(*palVar4)[0];
    sVar10 = (*palVar4)[1];
    lStack_b0 = (*palVar4)[2];
    pcVar3 = (char *)(*palVar4)[3];
    b[1] = in_stack_ffffffffffffff80._0_8_;
    b[2] = in_stack_ffffffffffffff80._8_8_;
    b[3] = in_stack_ffffffffffffff80._16_8_;
    b[0] = (longlong)pAVar9;
    expr = pIVar6;
    this = pAVar7;
    macroName = pSVar8;
    this_00 = pAVar9;
    local_c0 = pcVar2;
    sStack_b8 = sVar10;
    pcStack_a8 = pcVar3;
    local_a0 = pIVar6;
    pAStack_98 = pAVar7;
    pSStack_90 = pSVar8;
    kernels::multiply<signed_char>(in_stack_ffffffffffffff98,b);
    palVar4 = AlignedVector<signed_char>::as<long_long__vector(4)>
                        ((AlignedVector<signed_char> *)&stack0xffffffffffffff88);
    (*palVar4)[0] = (longlong)pIVar6;
    (*palVar4)[1] = (longlong)pAVar7;
    (*palVar4)[2] = (longlong)pSVar8;
    (*palVar4)[3] = (longlong)pAVar9;
    for (local_c8 = 0; uVar1 = local_c8,
        sVar5 = AlignedVector<signed_char>::size
                          ((AlignedVector<signed_char> *)&stack0xffffffffffffff88), uVar1 < sVar5;
        local_c8 = local_c8 + 1) {
      local_120 = operator____catch_sr((char *)this,(size_t)expr);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/multiply_test.cc"
                 ,0x1b);
      Catch::StringRef::StringRef((StringRef *)this_00,(char *)macroName);
      capturedExpression.m_size = sVar10;
      capturedExpression.m_start = pcVar2;
      Catch::AssertionHandler::AssertionHandler
                (this_00,macroName,(SourceLineInfo *)this,capturedExpression,
                 (Flags)((ulong)expr >> 0x20));
      AlignedVector<signed_char>::operator[]
                ((AlignedVector<signed_char> *)&stack0xffffffffffffff88,local_c8);
      Catch::Decomposer::operator<=((Decomposer *)expr,(char *)0x270cd2);
      AlignedVector<signed_char>::operator[](&local_48,local_c8);
      AlignedVector<signed_char>::operator[]
                ((AlignedVector<signed_char> *)&stack0xffffffffffffffa8,local_c8);
      Catch::ExprLhs<signed_char_const&>::operator==(in_stack_fffffffffffffda0,pcVar3);
      Catch::AssertionHandler::handleExpr(this,expr);
      Catch::BinaryExpr<const_signed_char_&,_const_signed_char_&>::~BinaryExpr
                ((BinaryExpr<const_signed_char_&,_const_signed_char_&> *)0x270d83);
      Catch::AssertionHandler::complete(this);
      Catch::AssertionHandler::~AssertionHandler(this);
    }
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x270eb7);
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x270ec4);
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x270ed1);
  }
  return;
}

Assistant:

void kernel_multiply_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, Type_>;
  constexpr int VECTOR_LENGTH = sizeof(vec_t) / sizeof(Type_);

  AlignedVector<Type_> input1(VECTOR_LENGTH);
  AlignedVector<Type_> input2(VECTOR_LENGTH);
  AlignedVector<Type_> output(VECTOR_LENGTH);

  std::iota(input1.begin(), input1.end(), static_cast<Type_>(-VECTOR_LENGTH / 2));
  std::iota(input2.begin(), input2.end(), static_cast<Type_>(-VECTOR_LENGTH / 3));

  *output.template as<vec_t>() = kernels::multiply<Type_>(*input1.template as<vec_t>(), *input2.template as<vec_t>());
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == Type_(input1[i] * input2[i]));
}